

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

int Dar2_LibEval_rec(Dar_LibObj_t *pObj,int Out)

{
  Dar_LibDat_t *pDVar1;
  Dar_LibObj_t DVar2;
  Dar_Lib_t *pDVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  while( true ) {
    pDVar3 = s_DarLib;
    if (s_DarLib->pDatas[(ulong)*pObj >> 0x24].TravId == Out) {
      return iVar5;
    }
    pDVar1 = s_DarLib->pDatas + ((ulong)*pObj >> 0x24);
    pDVar1->TravId = Out;
    DVar2 = *pObj;
    if (((ulong)DVar2 >> 0x23 & 1) != 0) {
      return iVar5;
    }
    if ((ulong)DVar2 >> 0x26 == 0) {
      __assert_fail("pObj->Num > 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darLib.c"
                    ,0x487,"int Dar2_LibEval_rec(Dar_LibObj_t *, int)");
    }
    if (-1 < (pDVar1->field_0).iGunc) break;
    iVar4 = Dar2_LibEval_rec((Dar_LibObj_t *)
                             (&pDVar3->pObjs->field_0x0 + ((DVar2._0_4_ & 0xffff) << 3)),Out);
    pObj = s_DarLib->pObjs + *(ushort *)&pObj->field_0x2;
    iVar5 = iVar5 + iVar4 + 1;
  }
  return iVar5;
}

Assistant:

int Dar2_LibEval_rec( Dar_LibObj_t * pObj, int Out )
{
    Dar_LibDat_t * pData;
    int Area;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->TravId == Out )
        return 0;
    pData->TravId = Out;
    if ( pObj->fTerm )
        return 0;
    assert( pObj->Num > 3 );
    if ( pData->iGunc >= 0 )//&& !pData->fMffc )
        return 0;
    // this is a new node - get a bound on the area of its branches
//    nNodesSaved--;
    Area = Dar2_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan0), Out );
//    if ( Area > nNodesSaved )
//        return 0xff;
    Area += Dar2_LibEval_rec( Dar_LibObj(s_DarLib, pObj->Fan1), Out );
//    if ( Area > nNodesSaved )
//        return 0xff;
    return Area + 1;
}